

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O2

void __thiscall ezexample::setup_for_predict(ezexample *this)

{
  int iVar1;
  
  if (setup_for_predict()::empty_example == '\0') {
    iVar1 = __cxa_guard_acquire(&setup_for_predict()::empty_example);
    if (iVar1 != 0) {
      if (this->is_multiline == true) {
        setup_for_predict::empty_example = VW::read_example(this->vw_par_ref,"");
      }
      else {
        setup_for_predict::empty_example = (example *)0x0;
      }
      __cxa_guard_release(&setup_for_predict()::empty_example);
    }
  }
  if (this->example_changed_since_prediction == true) {
    mini_setup_example(this);
    vw::learn(this->vw_ref,this->ec);
    if (this->is_multiline == true) {
      vw::learn(this->vw_ref,setup_for_predict::empty_example);
    }
    this->example_changed_since_prediction = false;
  }
  return;
}

Assistant:

void setup_for_predict()
  {
    static example* empty_example = is_multiline ? VW::read_example(*vw_par_ref, (char*)"") : nullptr;
    if (example_changed_since_prediction)
    {
      mini_setup_example();
      vw_ref->learn(*ec);
      if (is_multiline)
        vw_ref->learn(*empty_example);
      example_changed_since_prediction = false;
    }
  }